

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall HModel::scaleModel(HModel *this)

{
  int iVar1;
  pointer piVar2;
  pointer pdVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  bool bVar8;
  vector<double,_std::allocator<double>_> *pvVar9;
  uint uVar10;
  pointer pdVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  size_type __n;
  ulong uVar16;
  int iVar17;
  int search_count;
  int iVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double inf;
  vector<double,_std::allocator<double>_> rowMin;
  vector<double,_std::allocator<double>_> rowMax;
  allocator_type local_81;
  value_type_conflict1 local_80;
  value_type_conflict1 local_78;
  vector<double,_std::allocator<double>_> local_70;
  vector<double,_std::allocator<double>_> local_58;
  vector<double,_std::allocator<double>_> *local_40;
  vector<double,_std::allocator<double>_> *local_38;
  
  if (this->intOption[2] != 0) {
    local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&DAT_3ff0000000000000;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&this->colScale,(long)this->numCol,(value_type_conflict1 *)&local_70);
    local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&DAT_3ff0000000000000;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&this->rowScale,(long)this->numRow,(value_type_conflict1 *)&local_70);
    local_78 = 1e+200;
    iVar18 = this->numCol;
    lVar12 = (long)(this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar18];
    if (0 < lVar12) {
      lVar15 = 0;
      dVar21 = 0.0;
      dVar22 = 1e+200;
      do {
        dVar20 = ABS((this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar15]);
        dVar23 = dVar20;
        if (dVar22 <= dVar20) {
          dVar23 = dVar22;
        }
        if (dVar20 <= dVar21) {
          dVar20 = dVar21;
        }
        lVar15 = lVar15 + 1;
        dVar21 = dVar20;
        dVar22 = dVar23;
      } while (lVar12 != lVar15);
      if ((dVar23 < 0.2) || (5.0 < dVar20)) {
        if (iVar18 < 1) {
          bVar8 = false;
        }
        else {
          lVar12 = 0;
          dVar21 = 1e+200;
          do {
            dVar22 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar12] * (double)this->objSense;
            if (((dVar22 != 0.0) || (dVar20 = dVar21, NAN(dVar22))) &&
               (dVar20 = ABS(dVar22), dVar21 <= ABS(dVar22))) {
              dVar20 = dVar21;
            }
            lVar12 = lVar12 + 1;
            dVar21 = dVar20;
          } while (iVar18 != lVar12);
          bVar8 = dVar20 < 0.1;
        }
        local_40 = &this->colScale;
        local_38 = &this->rowScale;
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_70,(long)this->numRow,&local_78,(allocator_type *)&local_58);
        local_80 = 1e-200;
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_58,(long)this->numRow,&local_80,&local_81);
        iVar18 = 0;
        do {
          if (0 < this->numCol) {
            lVar12 = 0;
            do {
              dVar22 = (double)this->objSense *
                       (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar12];
              dVar21 = 1e+200;
              dVar20 = 1e-200;
              if ((bool)(dVar22 != 0.0 & bVar8)) {
                dVar20 = ABS(dVar22);
                dVar21 = dVar20;
                if (1e+200 <= dVar20) {
                  dVar21 = 1e+200;
                }
                if (dVar20 <= 1e-200) {
                  dVar20 = 1e-200;
                }
              }
              piVar2 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              iVar17 = piVar2[lVar12];
              lVar15 = (long)iVar17;
              iVar1 = piVar2[lVar12 + 1];
              if (iVar17 < iVar1) {
                dVar22 = dVar21;
                do {
                  dVar23 = ABS((this->Avalue).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar15]) *
                           (this->rowScale).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start
                           [(this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar15]];
                  dVar21 = dVar23;
                  if (dVar22 <= dVar23) {
                    dVar21 = dVar22;
                  }
                  if (dVar23 <= dVar20) {
                    dVar23 = dVar20;
                  }
                  dVar20 = dVar23;
                  lVar15 = lVar15 + 1;
                  dVar22 = dVar21;
                } while (iVar1 != lVar15);
              }
              dVar21 = dVar21 * dVar20;
              if (dVar21 < 0.0) {
                dVar21 = sqrt(dVar21);
              }
              else {
                dVar21 = SQRT(dVar21);
              }
              lVar15 = lVar12 + 1;
              pdVar11 = (this->colScale).super__Vector_base<double,_std::allocator<double>_>._M_impl
                        .super__Vector_impl_data._M_start;
              pdVar11[lVar12] = 1.0 / dVar21;
              piVar2 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              iVar17 = piVar2[lVar12];
              lVar13 = (long)iVar17;
              iVar1 = piVar2[lVar15];
              if (iVar17 < iVar1) {
                piVar2 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                pdVar3 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                do {
                  dVar21 = ABS(pdVar3[lVar13]) * pdVar11[lVar12];
                  iVar17 = piVar2[lVar13];
                  dVar22 = dVar21;
                  if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar17] <= dVar21) {
                    dVar22 = local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar17];
                  }
                  local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar17] = dVar22;
                  if (dVar21 <= local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start[iVar17]) {
                    dVar21 = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar17];
                  }
                  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar17] = dVar21;
                  lVar13 = lVar13 + 1;
                } while (iVar1 != lVar13);
              }
              lVar12 = lVar15;
            } while (lVar15 < this->numCol);
          }
          __n = (size_type)this->numRow;
          if (0 < (long)__n) {
            lVar12 = 0;
            do {
              dVar21 = local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar12] *
                       local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar12];
              if (dVar21 < 0.0) {
                dVar21 = sqrt(dVar21);
              }
              else {
                dVar21 = SQRT(dVar21);
              }
              (this->rowScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar12] = 1.0 / dVar21;
              lVar12 = lVar12 + 1;
              __n = (size_type)this->numRow;
            } while (lVar12 < (long)__n);
          }
          std::vector<double,_std::allocator<double>_>::_M_fill_assign(&local_70,__n,&local_78);
          local_80 = 1e-200;
          std::vector<double,_std::allocator<double>_>::_M_fill_assign
                    (&local_58,(long)this->numRow,&local_80);
          pvVar9 = local_38;
          iVar18 = iVar18 + 1;
        } while (iVar18 != 6);
        uVar14 = (ulong)(uint)this->numCol;
        if (0 < this->numCol) {
          pdVar11 = (local_40->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          lVar12 = 0;
          do {
            dVar21 = log(pdVar11[lVar12]);
            dVar21 = floor(dVar21 / 0.6931471805599453 + 0.5);
            dVar21 = exp2(dVar21);
            pdVar11 = (this->colScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar11[lVar12] = dVar21;
            lVar12 = lVar12 + 1;
            uVar14 = (ulong)this->numCol;
          } while (lVar12 < (long)uVar14);
        }
        uVar10 = this->numRow;
        if (0 < (int)uVar10) {
          pdVar11 = (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          lVar12 = 0;
          do {
            dVar21 = log(pdVar11[lVar12]);
            dVar21 = floor(dVar21 / 0.6931471805599453 + 0.5);
            dVar21 = exp2(dVar21);
            pdVar11 = (this->rowScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar11[lVar12] = dVar21;
            lVar12 = lVar12 + 1;
            uVar10 = this->numRow;
          } while (lVar12 < (int)uVar10);
          uVar14 = (ulong)(uint)this->numCol;
        }
        iVar18 = (int)uVar14;
        uVar14 = uVar14 & 0xffffffff;
        if (0 < iVar18) {
          piVar2 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar4 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar11 = (this->colScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar3 = (this->rowScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar5 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar19 = 0;
          iVar17 = *piVar2;
          do {
            iVar1 = piVar2[uVar19 + 1];
            if (iVar17 < iVar1) {
              lVar12 = (long)iVar17;
              do {
                pdVar5[lVar12] = pdVar11[uVar19] * pdVar3[piVar4[lVar12]] * pdVar5[lVar12];
                lVar12 = lVar12 + 1;
              } while (iVar1 != lVar12);
            }
            uVar19 = uVar19 + 1;
            iVar17 = iVar1;
          } while (uVar19 != uVar14);
          if (0 < iVar18) {
            pdVar11 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar3 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar5 = (this->colScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar6 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar19 = 0;
            do {
              dVar21 = pdVar3[uVar19];
              dVar22 = 1.0;
              if ((dVar21 != -1e+200) || (NAN(dVar21))) {
                dVar22 = pdVar5[uVar19];
              }
              pdVar3[uVar19] = dVar21 / dVar22;
              dVar21 = pdVar6[uVar19];
              dVar22 = 1.0;
              if ((dVar21 != 1e+200) || (NAN(dVar21))) {
                dVar22 = pdVar5[uVar19];
              }
              pdVar6[uVar19] = dVar21 / dVar22;
              pdVar11[uVar19] = pdVar5[uVar19] * pdVar11[uVar19];
              uVar19 = uVar19 + 1;
            } while (uVar14 != uVar19);
          }
        }
        uVar19 = (ulong)uVar10;
        if (0 < (int)uVar10) {
          pdVar11 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar3 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar5 = (this->rowScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar16 = 0;
          do {
            dVar21 = pdVar11[uVar16];
            dVar22 = 1.0;
            if ((dVar21 != -1e+200) || (NAN(dVar21))) {
              dVar22 = pdVar5[uVar16];
            }
            pdVar11[uVar16] = dVar21 * dVar22;
            dVar21 = pdVar3[uVar16];
            dVar22 = 1.0;
            if ((dVar21 != 1e+200) || (NAN(dVar21))) {
              dVar22 = pdVar5[uVar16];
            }
            pdVar3[uVar16] = dVar21 * dVar22;
            uVar16 = uVar16 + 1;
          } while (uVar19 != uVar16);
        }
        if (this->impliedBoundsPresolve == true) {
          if (0 < iVar18) {
            pdVar11 = (this->primalColLowerImplied).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar3 = (this->colScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar5 = (this->primalColUpperImplied).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar6 = (this->dualColLowerImplied).super__Vector_base<double,_std::allocator<double>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pdVar7 = (this->dualColUpperImplied).super__Vector_base<double,_std::allocator<double>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar16 = 0;
            do {
              dVar21 = pdVar11[uVar16];
              dVar22 = 1.0;
              if ((dVar21 != -1e+200) || (NAN(dVar21))) {
                dVar22 = pdVar3[uVar16];
              }
              pdVar11[uVar16] = dVar21 / dVar22;
              dVar21 = pdVar5[uVar16];
              dVar22 = 1.0;
              if ((dVar21 != 1e+200) || (NAN(dVar21))) {
                dVar22 = pdVar3[uVar16];
              }
              pdVar5[uVar16] = dVar21 / dVar22;
              dVar21 = pdVar6[uVar16];
              dVar22 = 1.0;
              if ((dVar21 != -1e+200) || (NAN(dVar21))) {
                dVar22 = pdVar3[uVar16];
              }
              pdVar6[uVar16] = dVar21 * dVar22;
              dVar21 = pdVar7[uVar16];
              dVar22 = 1.0;
              if ((dVar21 != 1e+200) || (NAN(dVar21))) {
                dVar22 = pdVar3[uVar16];
              }
              pdVar7[uVar16] = dVar21 * dVar22;
              uVar16 = uVar16 + 1;
            } while (uVar14 != uVar16);
          }
          if (0 < (int)uVar10) {
            pdVar11 = (this->primalRowLowerImplied).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar3 = (this->rowScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar5 = (this->primalRowUpperImplied).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar6 = (this->dualRowLowerImplied).super__Vector_base<double,_std::allocator<double>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pdVar7 = (this->dualRowUpperImplied).super__Vector_base<double,_std::allocator<double>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar16 = 0;
            do {
              dVar21 = pdVar11[uVar16];
              dVar22 = 1.0;
              if ((dVar21 != -1e+200) || (NAN(dVar21))) {
                dVar22 = pdVar3[uVar16];
              }
              pdVar11[uVar16] = dVar21 * dVar22;
              dVar21 = pdVar5[uVar16];
              dVar22 = 1.0;
              if ((dVar21 != 1e+200) || (NAN(dVar21))) {
                dVar22 = pdVar3[uVar16];
              }
              pdVar5[uVar16] = dVar21 * dVar22;
              dVar21 = pdVar6[uVar16];
              dVar22 = 1.0;
              if ((dVar21 != -1e+200) || (NAN(dVar21))) {
                dVar22 = pdVar3[uVar16];
              }
              pdVar6[uVar16] = dVar21 / dVar22;
              dVar21 = pdVar7[uVar16];
              dVar22 = 1.0;
              if ((dVar21 != 1e+200) || (NAN(dVar21))) {
                dVar22 = pdVar3[uVar16];
              }
              pdVar7[uVar16] = dVar21 / dVar22;
              uVar16 = uVar16 + 1;
            } while (uVar19 != uVar16);
          }
        }
        if (this->mlFg_haveSavedBounds != 0) {
          if (0 < iVar18) {
            pdVar11 = (this->SvColLower).super__Vector_base<double,_std::allocator<double>_>._M_impl
                      .super__Vector_impl_data._M_start;
            pdVar3 = (this->colScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar5 = (this->SvColUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar16 = 0;
            do {
              dVar21 = pdVar11[uVar16];
              if (-1e+200 < dVar21) {
                pdVar11[uVar16] = dVar21 * pdVar3[uVar16];
              }
              dVar21 = pdVar5[uVar16];
              if (dVar21 < 1e+200) {
                pdVar5[uVar16] = dVar21 * pdVar3[uVar16];
              }
              uVar16 = uVar16 + 1;
            } while (uVar14 != uVar16);
          }
          if (0 < (int)uVar10) {
            pdVar11 = (this->SvRowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl
                      .super__Vector_impl_data._M_start;
            pdVar3 = (this->rowScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar5 = (this->SvRowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar14 = 0;
            do {
              dVar21 = pdVar11[uVar14];
              if (-1e+200 < dVar21) {
                pdVar11[uVar14] = dVar21 * pdVar3[uVar14];
              }
              dVar21 = pdVar5[uVar14];
              if (dVar21 < 1e+200) {
                pdVar5[uVar14] = dVar21 * pdVar3[uVar14];
              }
              uVar14 = uVar14 + 1;
            } while (uVar19 != uVar14);
          }
        }
        mlFg_Update(this,this->mlFg_action_ScaleLP);
        if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
    }
  }
  return;
}

Assistant:

void HModel::scaleModel() {
  if (intOption[INTOPT_SCALE_FLAG] == 0) {
    //    printf("NOT SCALING MATRIX\n");
    return;}
  
  // Reset all scaling to 1
  colScale.assign(numCol, 1);
  rowScale.assign(numRow, 1);

    // Find out min0 / max0, skip on if in [0.2, 5]
    const double inf = HSOL_CONST_INF;
    double min0 = inf, max0 = 0;
    for (int k = 0, AnX = Astart[numCol]; k < AnX; k++) {
        double value = fabs(Avalue[k]);
        min0 = min(min0, value);
        max0 = max(max0, value);
    }
    if (min0 >= 0.2 && max0 <= 5)
        return;

    // See if we want to include cost include if min-cost < 0.1
    double minc = inf;
    for (int i = 0; i < numCol; i++) {
      double sense_col_cost = objSense*colCost[i];
      if (sense_col_cost)
	minc = min(minc, fabs(sense_col_cost));
    }
    bool doCost = minc < 0.1;

    // Search up to 6 times
    vector<double> rowMin(numRow, inf);
    vector<double> rowMax(numRow, 1 / inf);
    for (int search_count = 0; search_count < 6; search_count++) {
        // Find column scale, prepare row data
        for (int iCol = 0; iCol < numCol; iCol++) {
            // For column scale (find)
            double colMin = inf;
            double colMax = 1 / inf;
	    double sense_col_cost = objSense*colCost[iCol];
            double myCost = fabs(sense_col_cost);
            if (doCost && myCost != 0)
                colMin = min(colMin, myCost), colMax = max(colMax, myCost);
            for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
                double value = fabs(Avalue[k]) * rowScale[Aindex[k]];
                colMin = min(colMin, value), colMax = max(colMax, value);
            }
            colScale[iCol] = 1 / sqrt(colMin * colMax);

            // For row scale (only collect)
            for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
                int iRow = Aindex[k];
                double value = fabs(Avalue[k]) * colScale[iCol];
                rowMin[iRow] = min(rowMin[iRow], value);
                rowMax[iRow] = max(rowMax[iRow], value);
            }
        }

        // For row scale (find)
        for (int iRow = 0; iRow < numRow; iRow++)
            rowScale[iRow] = 1 / sqrt(rowMin[iRow] * rowMax[iRow]);
        rowMin.assign(numRow, inf);
        rowMax.assign(numRow, 1 / inf);
    }

    // Make it numerical better
    const double ln2 = log(2.0);
    for (int iCol = 0; iCol < numCol; iCol++)
        colScale[iCol] = pow(2.0, floor(log(colScale[iCol]) / ln2 + 0.5));
    for (int iRow = 0; iRow < numRow; iRow++)
        rowScale[iRow] = pow(2.0, floor(log(rowScale[iRow]) / ln2 + 0.5));

    // Apply scaling to matrix and bounds
    for (int iCol = 0; iCol < numCol; iCol++)
        for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++)
            Avalue[k] *= (colScale[iCol] * rowScale[Aindex[k]]);

    for (int iCol = 0; iCol < numCol; iCol++) {
        colLower[iCol] /= colLower[iCol] == -inf ? 1 : colScale[iCol];
        colUpper[iCol] /= colUpper[iCol] == +inf ? 1 : colScale[iCol];
        colCost[iCol] *= colScale[iCol];
    }
    for (int iRow = 0; iRow < numRow; iRow++) {
        rowLower[iRow] *= rowLower[iRow] == -inf ? 1 : rowScale[iRow];
        rowUpper[iRow] *= rowUpper[iRow] == +inf ? 1 : rowScale[iRow];
    }
	if (impliedBoundsPresolve) {
		for (int iCol = 0; iCol < numCol; iCol++) {
			primalColLowerImplied[iCol] /= primalColLowerImplied[iCol] == -inf ? 1 : colScale[iCol];
			primalColUpperImplied[iCol] /= primalColUpperImplied[iCol] == +inf ? 1 : colScale[iCol];
			dualColLowerImplied[iCol] *= dualColLowerImplied[iCol] == -inf ? 1 : colScale[iCol];
			dualColUpperImplied[iCol] *= dualColUpperImplied[iCol] == +inf ? 1 : colScale[iCol];
		}
		for (int iRow = 0; iRow < numRow; iRow++) {
			primalRowLowerImplied[iRow] *= primalRowLowerImplied[iRow] == -inf ? 1 : rowScale[iRow];
			primalRowUpperImplied[iRow] *= primalRowUpperImplied[iRow] == +inf ? 1 : rowScale[iRow];
			dualRowLowerImplied[iRow] /= dualRowLowerImplied[iRow] == -inf ? 1 : rowScale[iRow];
			dualRowUpperImplied[iRow] /= dualRowUpperImplied[iRow] == +inf ? 1 : rowScale[iRow];
		}
	}

	if (mlFg_haveSavedBounds) {
	  //Model has saved bounds which must also be scaled so they are consistent when recovered
	  for (int col = 0; col < numCol; col++) {
	    if (!hsol_isInfinity(-SvColLower[col])) SvColLower[col] *= colScale[col];
	    if (!hsol_isInfinity( SvColUpper[col])) SvColUpper[col] *= colScale[col];
	  }
	  for (int row = 0; row < numRow; row++) {
	    if (!hsol_isInfinity(-SvRowLower[row])) SvRowLower[row] *= rowScale[row];
	    if (!hsol_isInfinity( SvRowUpper[row])) SvRowUpper[row] *= rowScale[row];
	  }
	}
    //Deduce the consequences of scaling the LP
    mlFg_Update(mlFg_action_ScaleLP);
}